

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall
re2::Compiler::UncachedRuneByteSuffix(Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  Inst *inst0;
  ulong uVar1;
  PatchList PVar2;
  Frag FVar3;
  uint32_t uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  undefined7 in_register_00000031;
  
  FVar3 = ByteRange(this,(int)CONCAT71(in_register_00000031,lo),
                    (int)CONCAT71(in_register_00000011,hi),foldcase);
  uVar5 = (ulong)FVar3 >> 0x20;
  inst0 = (this->inst_).ptr_._M_t.
          super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
          super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
          super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
  if (next == 0) {
    PVar2 = PatchList::Append(inst0,(this->rune_range_).end.p,FVar3.end.p);
    (this->rune_range_).end.p = PVar2.p;
  }
  else if (uVar5 != 0) {
    do {
      uVar1 = uVar5 >> 1;
      if ((uVar5 & 1) == 0) {
        uVar4 = inst0[uVar1].out_opcode_ >> 4;
        inst0[uVar1].out_opcode_ = inst0[uVar1].out_opcode_ & 0xf | next << 4;
      }
      else {
        uVar4 = inst0[uVar1].field_1.out1_;
        inst0[uVar1].field_1.cap_ = next;
      }
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  return FVar3.begin;
}

Assistant:

int Compiler::UncachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                     int next) {
  Frag f = ByteRange(lo, hi, foldcase);
  if (next != 0) {
    PatchList::Patch(inst_.data(), f.end, next);
  } else {
    rune_range_.end = PatchList::Append(inst_.data(), rune_range_.end, f.end);
  }
  return f.begin;
}